

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::ParseDirpathFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  _Any_data *p_Var1;
  long lVar2;
  undefined8 *puVar3;
  ScalarFunctionSet *in_RDI;
  undefined8 *puVar4;
  byte bVar5;
  initializer_list<duckdb::LogicalType> __l;
  ScalarFunction func;
  allocator_type local_439;
  ScalarFunctionSet *local_438;
  code *local_430;
  undefined8 local_428;
  code *local_420;
  code *local_418;
  _Any_data *local_410;
  LogicalType local_408 [24];
  LogicalType local_3f0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3d8;
  LogicalType local_3c0 [24];
  undefined1 local_3a8 [144];
  LogicalType aLStack_318 [32];
  _Any_data _Stack_2f8;
  _Manager_type local_2e8;
  undefined8 auStack_2d8 [9];
  element_type *local_290;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  undefined1 local_280 [176];
  _Any_data _Stack_1d0;
  _Manager_type local_1c0;
  undefined8 auStack_1b0 [9];
  element_type *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  undefined1 local_158 [176];
  _Any_data local_a8;
  _Manager_type local_98;
  undefined8 local_88 [9];
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar5 = 0;
  local_438 = in_RDI;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_3f0,VARCHAR);
  __l._M_len = 1;
  __l._M_array = local_3f0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3d8,__l,&local_439);
  duckdb::LogicalType::LogicalType(local_408,VARCHAR);
  local_428 = 0;
  local_430 = ParseDirpathFunction;
  local_418 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_420 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_3c0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_3a8,&local_3d8,local_408,&local_430,0,0,0,0,local_3c0,0,1,0);
  duckdb::LogicalType::~LogicalType(local_3c0);
  if (local_420 != (code *)0x0) {
    (*local_420)(&local_430,&local_430,3);
  }
  duckdb::LogicalType::~LogicalType(local_408);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3d8);
  duckdb::LogicalType::~LogicalType(local_3f0);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_280,(SimpleFunction *)local_3a8);
  local_280._0_8_ = duckdb::Value::DECIMAL;
  duckdb::LogicalType::LogicalType((LogicalType *)(local_280 + 0x90),aLStack_318);
  local_280[0xa8] = aLStack_318[0x18];
  local_280[0xa9] = aLStack_318[0x19];
  local_280[0xaa] = aLStack_318[0x1a];
  local_280[0xab] = aLStack_318[0x1b];
  local_280._0_8_ = &PTR__ScalarFunction_008914d8;
  local_410 = &_Stack_2f8;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &_Stack_1d0,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             local_410);
  puVar3 = auStack_2d8;
  puVar4 = auStack_1b0;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  local_168 = local_290;
  local_160._M_pi = local_288._M_pi;
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
    }
  }
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
         (local_438 + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,(ScalarFunction *)local_280);
  local_280._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
  }
  if (local_1c0 != (_Manager_type)0x0) {
    (*local_1c0)(&_Stack_1d0,&_Stack_1d0,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_280);
  std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)(local_3a8 + 0x48),
             (LogicalTypeId *)&LogicalType::VARCHAR);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_158,(SimpleFunction *)local_3a8);
  local_158._0_8_ = duckdb::Value::DECIMAL;
  duckdb::LogicalType::LogicalType((LogicalType *)(local_158 + 0x90),aLStack_318);
  p_Var1 = local_410;
  local_158[0xa8] = aLStack_318[0x18];
  local_158[0xa9] = aLStack_318[0x19];
  local_158[0xaa] = aLStack_318[0x1a];
  local_158[0xab] = aLStack_318[0x1b];
  local_158._0_8_ = &PTR__ScalarFunction_008914d8;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_a8,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             local_410);
  puVar3 = auStack_2d8;
  puVar4 = local_88;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  local_40 = local_290;
  local_38._M_pi = local_288._M_pi;
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,(ScalarFunction *)local_158);
  local_158._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_98 != (_Manager_type)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_158);
  local_3a8._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
  }
  if (local_2e8 != (_Manager_type)0x0) {
    (*local_2e8)(p_Var1,p_Var1,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3a8);
  return local_438;
}

Assistant:

ScalarFunctionSet ParseDirpathFun::GetFunctions() {
	ScalarFunctionSet parse_dirpath;
	ScalarFunction func({LogicalType::VARCHAR}, LogicalType::VARCHAR, ParseDirpathFunction, nullptr, nullptr, nullptr,
	                    nullptr, LogicalType::INVALID, FunctionStability::CONSISTENT,
	                    FunctionNullHandling::SPECIAL_HANDLING);
	parse_dirpath.AddFunction(func);
	// separator options
	func.arguments.emplace_back(LogicalType::VARCHAR);
	parse_dirpath.AddFunction(func);
	return parse_dirpath;
}